

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemCopy(Mem *pTo,Mem *pFrom)

{
  u8 uVar1;
  u8 uVar2;
  int iVar3;
  int local_1c;
  int rc;
  Mem *pFrom_local;
  Mem *pTo_local;
  
  local_1c = 0;
  if ((pTo->flags & 0x2460) != 0) {
    vdbeMemClearExternAndSetNull(pTo);
  }
  pTo->u = pFrom->u;
  uVar1 = pFrom->enc;
  uVar2 = pFrom->eSubtype;
  iVar3 = pFrom->n;
  pTo->flags = pFrom->flags;
  pTo->enc = uVar1;
  pTo->eSubtype = uVar2;
  pTo->n = iVar3;
  pTo->z = pFrom->z;
  pTo->flags = pTo->flags & 0xfbff;
  if (((pTo->flags & 0x12) != 0) && ((pFrom->flags & 0x800) == 0)) {
    pTo->flags = pTo->flags | 0x1000;
    local_1c = sqlite3VdbeMemMakeWriteable(pTo);
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCopy(Mem *pTo, const Mem *pFrom){
  int rc = SQLITE_OK;

  assert( (pFrom->flags & MEM_RowSet)==0 );
  if( VdbeMemDynamic(pTo) ) vdbeMemClearExternAndSetNull(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->flags &= ~MEM_Dyn;
  if( pTo->flags&(MEM_Str|MEM_Blob) ){
    if( 0==(pFrom->flags&MEM_Static) ){
      pTo->flags |= MEM_Ephem;
      rc = sqlite3VdbeMemMakeWriteable(pTo);
    }
  }

  return rc;
}